

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcGlyphAttrMatrix.h
# Opt level: O2

bool __thiscall
GrcGlyphAttrMatrix::DefinedButMaybeShadow
          (GrcGlyphAttrMatrix *this,gid16 wGlyphID,int nAttrID,bool *pfShadow,int nStyle)

{
  GrcAssignment *pGVar1;
  int iVar2;
  
  if (this->m_cStyles == 0 || (this->m_cGlyphIDs == 0 || this->m_cGlyphAttrs == 0)) {
    return false;
  }
  pGVar1 = this->m_prgasgnx;
  iVar2 = (int)this->m_cStyles * ((int)this->m_cGlyphAttrs * (uint)wGlyphID + nAttrID) + nStyle;
  *pfShadow = pGVar1[iVar2].m_fShadow;
  return pGVar1[iVar2].m_pexp != (GdlExpression *)0x0;
}

Assistant:

bool DefinedButMaybeShadow(gid16 wGlyphID, int nAttrID, bool *pfShadow, int nStyle = 0)
	{
		if (m_cGlyphAttrs == 0 || m_cGlyphIDs == 0 || m_cStyles == 0)
			return false;
		GrcAssignment * pasgnx = m_prgasgnx + Index(wGlyphID, nAttrID, nStyle);
		*pfShadow = pasgnx->m_fShadow;
		return (pasgnx->Expression());
	}